

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_ray_tracing_reorder.cpp
# Opt level: O0

spv_result_t spvtools::val::RayReorderNVPass(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  StorageClass SVar2;
  Op OVar3;
  uint32_t uVar4;
  spv_result_t sVar5;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *pvVar6;
  size_type sVar7;
  char *pcVar8;
  Function *pFVar9;
  Instruction *array_type;
  DiagnosticStream *pDVar10;
  char *local_3638;
  DiagnosticStream local_3630;
  spv_result_t local_3454;
  char *pcStack_3450;
  spv_result_t error_25;
  DiagnosticStream local_3448;
  spv_result_t local_326c;
  char *pcStack_3268;
  spv_result_t error_24;
  DiagnosticStream local_3260;
  spv_result_t local_3084;
  char *pcStack_3080;
  spv_result_t error_23;
  DiagnosticStream local_3078;
  Instruction *local_2ea0;
  Instruction *result_id;
  char *pcStack_2e90;
  spv_result_t error_22;
  DiagnosticStream local_2e88;
  spv_result_t local_2cac;
  char *pcStack_2ca8;
  spv_result_t error_21;
  DiagnosticStream local_2ca0;
  spv_result_t local_2ac4;
  char *pcStack_2ac0;
  spv_result_t error_20;
  DiagnosticStream local_2ab8;
  spv_result_t local_28dc;
  undefined1 local_28d8 [4];
  spv_result_t error_19;
  uint32_t local_26fc;
  undefined1 local_26f8 [4];
  uint32_t bits_id_1;
  uint32_t local_251c;
  undefined1 local_2518 [4];
  uint32_t hint_id_1;
  function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  local_24f8;
  allocator<char> local_24d1;
  string local_24d0 [8];
  string opcode_name_1;
  undefined1 local_22d0 [4];
  uint32_t bits_id;
  uint32_t local_20f4;
  undefined1 local_20f0 [4];
  uint32_t hint_id;
  int local_1f18;
  spv_result_t local_1f14;
  undefined1 local_1f10 [4];
  spv_result_t error_18;
  function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  local_1ef0;
  allocator<char> local_1ec9;
  string local_1ec8 [8];
  string opcode_name;
  spv_result_t error_17;
  spv_result_t error_16;
  uint32_t local_1cc4;
  spv_result_t local_1cc0;
  uint32_t current_time_id;
  spv_result_t error_15;
  spv_result_t error_14;
  spv_result_t error_13;
  spv_result_t error_12;
  spv_result_t error_11;
  spv_result_t error_10;
  uint32_t local_1acc;
  undefined1 local_1ac8 [4];
  uint32_t ray_tmax;
  uint32_t local_18ec;
  undefined1 local_18e8 [4];
  uint32_t ray_direction;
  uint32_t local_170c;
  undefined1 local_1708 [4];
  uint32_t ray_tmin;
  uint32_t local_152c;
  undefined1 local_1528 [4];
  uint32_t ray_origin;
  uint32_t local_134c;
  spv_result_t local_1348;
  uint32_t miss_index;
  spv_result_t error_9;
  spv_result_t error_8;
  Op local_1164;
  Instruction *pIStack_1160;
  Op var_opcode_1;
  Instruction *variable_1;
  uint32_t hit_object_attr_id_1;
  spv_result_t error_7;
  Op local_f74;
  Instruction *pIStack_f70;
  Op var_opcode;
  Instruction *variable;
  uint32_t hit_object_attr_id;
  spv_result_t error_6;
  DiagnosticStream local_f58;
  spv_result_t local_d7c;
  char *pcStack_d78;
  spv_result_t error_5;
  DiagnosticStream local_d70;
  char *local_b98;
  DiagnosticStream local_b90;
  char *local_9b8;
  DiagnosticStream local_9b0;
  uint32_t local_7d4 [2];
  uint32_t component_type;
  uint32_t col_type;
  uint32_t num_cols;
  uint32_t num_rows;
  spv_result_t error_4;
  DiagnosticStream local_7b8;
  spv_result_t local_5dc;
  char *pcStack_5d8;
  spv_result_t error_3;
  DiagnosticStream local_5d0;
  spv_result_t local_3f4;
  char *pcStack_3f0;
  spv_result_t error_2;
  DiagnosticStream local_3e8;
  spv_result_t local_210;
  spv_result_t error_1;
  spv_result_t error;
  anon_class_1_0_00000001 local_29;
  uint32_t local_28;
  Op OStack_24;
  anon_class_1_0_00000001 RegisterOpcodeForValidModel;
  uint32_t result_type;
  Op opcode;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  OStack_24 = Instruction::opcode(inst);
  local_28 = Instruction::type_id(inst);
  switch(OStack_24) {
  case OpHitObjectGetWorldToObjectNV:
  case OpHitObjectGetObjectToWorldNV:
    RayReorderNVPass::anon_class_1_0_00000001::operator()(&local_29,_,inst);
    num_cols = ValidateHitObjectPointer(_,inst,2);
    if (num_cols != SPV_SUCCESS) {
      return num_cols;
    }
    col_type = 0;
    component_type = 0;
    local_7d4[1] = 0;
    local_7d4[0] = 0;
    bVar1 = ValidationState_t::GetMatrixTypeInfo
                      (_,local_28,&col_type,&component_type,local_7d4 + 1,local_7d4);
    if (!bVar1) {
      ValidationState_t::diag(&local_9b0,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar10 = DiagnosticStream::operator<<
                          (&local_9b0,(char (*) [38])"expected matrix type as Result Type: ");
      local_9b8 = spvOpcodeString(OStack_24);
      pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_9b8);
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      DiagnosticStream::~DiagnosticStream(&local_9b0);
      return sVar5;
    }
    if (component_type != 4) {
      ValidationState_t::diag(&local_b90,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar10 = DiagnosticStream::operator<<
                          (&local_b90,
                           (char (*) [56])"expected Result Type matrix to have a Column Count of 4")
      ;
      local_b98 = spvOpcodeString(OStack_24);
      pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_b98);
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      DiagnosticStream::~DiagnosticStream(&local_b90);
      return sVar5;
    }
    bVar1 = ValidationState_t::IsFloatScalarType(_,local_7d4[0]);
    if (((!bVar1) || (uVar4 = ValidationState_t::GetBitWidth(_,local_28), uVar4 != 0x20)) ||
       (col_type != 3)) {
      ValidationState_t::diag(&local_d70,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar10 = DiagnosticStream::operator<<
                          (&local_d70,
                           (char (*) [88])
                           "expected Result Type matrix to have a Column Type of 3-component 32-bit float vectors: "
                          );
      pcStack_d78 = spvOpcodeString(OStack_24);
      pDVar10 = DiagnosticStream::operator<<(pDVar10,&stack0xfffffffffffff288);
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      DiagnosticStream::~DiagnosticStream(&local_d70);
      return sVar5;
    }
    break;
  case OpHitObjectGetObjectRayDirectionNV:
  case OpHitObjectGetObjectRayOriginNV:
  case OpHitObjectGetWorldRayDirectionNV:
  case OpHitObjectGetWorldRayOriginNV:
    RayReorderNVPass::anon_class_1_0_00000001::operator()(&local_29,_,inst);
    local_d7c = ValidateHitObjectPointer(_,inst,2);
    if (local_d7c != SPV_SUCCESS) {
      return local_d7c;
    }
    bVar1 = ValidationState_t::IsFloatVectorType(_,local_28);
    if (((!bVar1) || (uVar4 = ValidationState_t::GetDimension(_,local_28), uVar4 != 3)) ||
       (uVar4 = ValidationState_t::GetBitWidth(_,local_28), uVar4 != 0x20)) {
      ValidationState_t::diag(&local_f58,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar10 = DiagnosticStream::operator<<
                          (&local_f58,
                           (char (*) [72])
                           "Expected 32-bit floating-point type 3-component vector as Result Type: "
                          );
      _hit_object_attr_id = spvOpcodeString(OStack_24);
      pDVar10 = DiagnosticStream::operator<<(pDVar10,(char **)&hit_object_attr_id);
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      DiagnosticStream::~DiagnosticStream(&local_f58);
      return sVar5;
    }
    break;
  case OpHitObjectTraceRayMotionNV:
    RayReorderNVPass::anon_class_1_0_00000001::operator()(&local_29,_,inst);
    current_time_id = ValidateHitObjectPointer(_,inst,0);
    if (current_time_id != SPV_SUCCESS) {
      return current_time_id;
    }
    local_1cc0 = ValidateHitObjectInstructionCommonParameters
                           (_,inst,1,0xffffffff,0xffffffff,0xffffffff,2,3,0xffffffff,0xffffffff,4,5,
                            0xffffffff,0xffffffff,6,7,8,9,10,0xc,0xffffffff);
    if (local_1cc0 != SPV_SUCCESS) {
      return local_1cc0;
    }
    local_1cc4 = ValidationState_t::GetOperandTypeId(_,inst,0xb);
    bVar1 = ValidationState_t::IsFloatScalarType(_,local_1cc4);
    if ((!bVar1) || (uVar4 = ValidationState_t::GetBitWidth(_,local_1cc4), uVar4 != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)&error_17,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar10 = DiagnosticStream::operator<<
                          ((DiagnosticStream *)&error_17,
                           (char (*) [49])"Current Times must be a 32-bit float scalar type");
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&error_17);
      return sVar5;
    }
    break;
  case OpHitObjectGetShaderRecordBufferHandleNV:
    RayReorderNVPass::anon_class_1_0_00000001::operator()(&local_29,_,inst);
    local_210 = ValidateHitObjectPointer(_,inst,2);
    if (local_210 != SPV_SUCCESS) {
      return local_210;
    }
    bVar1 = ValidationState_t::IsIntVectorType(_,local_28);
    if (((!bVar1) || (uVar4 = ValidationState_t::GetDimension(_,local_28), uVar4 != 2)) ||
       (uVar4 = ValidationState_t::GetBitWidth(_,local_28), uVar4 != 0x20)) {
      ValidationState_t::diag(&local_3e8,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar10 = DiagnosticStream::operator<<
                          (&local_3e8,
                           (char (*) [65])
                           "Expected 32-bit integer type 2-component vector as Result Type: ");
      pcStack_3f0 = spvOpcodeString(OStack_24);
      pDVar10 = DiagnosticStream::operator<<(pDVar10,&stack0xfffffffffffffc10);
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      DiagnosticStream::~DiagnosticStream(&local_3e8);
      return sVar5;
    }
    break;
  case OpHitObjectGetShaderBindingTableRecordIndexNV:
  case OpHitObjectGetHitKindNV:
  case OpHitObjectGetPrimitiveIndexNV:
  case OpHitObjectGetGeometryIndexNV:
  case OpHitObjectGetInstanceIdNV:
  case OpHitObjectGetInstanceCustomIndexNV:
    RayReorderNVPass::anon_class_1_0_00000001::operator()(&local_29,_,inst);
    local_3f4 = ValidateHitObjectPointer(_,inst,2);
    if (local_3f4 != SPV_SUCCESS) {
      return local_3f4;
    }
    bVar1 = ValidationState_t::IsIntScalarType(_,local_28);
    if ((!bVar1) || (uVar4 = ValidationState_t::GetBitWidth(_,local_28), uVar4 == 0)) {
      ValidationState_t::diag(&local_5d0,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar10 = DiagnosticStream::operator<<
                          (&local_5d0,
                           (char (*) [53])"Expected 32-bit integer type scalar as Result Type: ");
      pcStack_5d8 = spvOpcodeString(OStack_24);
      pDVar10 = DiagnosticStream::operator<<(pDVar10,&stack0xfffffffffffffa28);
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      DiagnosticStream::~DiagnosticStream(&local_5d0);
      return sVar5;
    }
    break;
  case OpHitObjectRecordEmptyNV:
    RayReorderNVPass::anon_class_1_0_00000001::operator()(&local_29,_,inst);
    sVar5 = ValidateHitObjectPointer(_,inst,0);
    goto joined_r0x00b6b4a6;
  case OpHitObjectTraceRayNV:
    RayReorderNVPass::anon_class_1_0_00000001::operator()(&local_29,_,inst);
    opcode_name.field_2._12_4_ = ValidateHitObjectPointer(_,inst,0);
    if (opcode_name.field_2._12_4_ != SPV_SUCCESS) {
      return opcode_name.field_2._12_4_;
    }
    sVar5 = ValidateHitObjectInstructionCommonParameters
                      (_,inst,1,0xffffffff,0xffffffff,0xffffffff,2,3,0xffffffff,0xffffffff,4,5,
                       0xffffffff,0xffffffff,6,7,8,9,10,0xb,0xffffffff);
    goto joined_r0x00b6b4a6;
  case OpHitObjectRecordHitNV:
    RayReorderNVPass::anon_class_1_0_00000001::operator()(&local_29,_,inst);
    error_14 = ValidateHitObjectPointer(_,inst,0);
    if (error_14 != SPV_SUCCESS) {
      return error_14;
    }
    sVar5 = ValidateHitObjectInstructionCommonParameters
                      (_,inst,1,2,3,4,0xffffffff,0xffffffff,5,0xffffffff,0xffffffff,0xffffffff,6,7,
                       0xffffffff,8,9,10,0xb,0xffffffff,0xc);
    goto joined_r0x00b6b4a6;
  case OpHitObjectRecordHitWithIndexNV:
    RayReorderNVPass::anon_class_1_0_00000001::operator()(&local_29,_,inst);
    error_12 = ValidateHitObjectPointer(_,inst,0);
    if (error_12 != SPV_SUCCESS) {
      return error_12;
    }
    sVar5 = ValidateHitObjectInstructionCommonParameters
                      (_,inst,1,2,3,4,0xffffffff,0xffffffff,5,6,0xffffffff,0xffffffff,0xffffffff,
                       0xffffffff,0xffffffff,7,8,9,10,0xffffffff,0xb);
    goto joined_r0x00b6b4a6;
  case OpHitObjectRecordMissNV:
    RayReorderNVPass::anon_class_1_0_00000001::operator()(&local_29,_,inst);
    local_1348 = ValidateHitObjectPointer(_,inst,0);
    if (local_1348 != SPV_SUCCESS) {
      return local_1348;
    }
    local_134c = ValidationState_t::GetOperandTypeId(_,inst,1);
    bVar1 = ValidationState_t::IsUnsignedIntScalarType(_,local_134c);
    if ((!bVar1) || (uVar4 = ValidationState_t::GetBitWidth(_,local_134c), uVar4 != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)local_1528,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar10 = DiagnosticStream::operator<<
                          ((DiagnosticStream *)local_1528,
                           (char (*) [39])"Miss Index must be a 32-bit int scalar");
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_1528);
      return sVar5;
    }
    local_152c = ValidationState_t::GetOperandTypeId(_,inst,2);
    bVar1 = ValidationState_t::IsFloatVectorType(_,local_152c);
    if (((!bVar1) || (uVar4 = ValidationState_t::GetDimension(_,local_152c), uVar4 != 3)) ||
       (uVar4 = ValidationState_t::GetBitWidth(_,local_152c), uVar4 != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)local_1708,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar10 = DiagnosticStream::operator<<
                          ((DiagnosticStream *)local_1708,
                           (char (*) [53])"Ray Origin must be a 32-bit float 3-component vector");
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_1708);
      return sVar5;
    }
    local_170c = ValidationState_t::GetOperandTypeId(_,inst,3);
    bVar1 = ValidationState_t::IsFloatScalarType(_,local_170c);
    if ((!bVar1) || (uVar4 = ValidationState_t::GetBitWidth(_,local_170c), uVar4 != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)local_18e8,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar10 = DiagnosticStream::operator<<
                          ((DiagnosticStream *)local_18e8,
                           (char (*) [39])"Ray TMin must be a 32-bit float scalar");
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_18e8);
      return sVar5;
    }
    local_18ec = ValidationState_t::GetOperandTypeId(_,inst,4);
    bVar1 = ValidationState_t::IsFloatVectorType(_,local_18ec);
    if (((!bVar1) || (uVar4 = ValidationState_t::GetDimension(_,local_18ec), uVar4 != 3)) ||
       (uVar4 = ValidationState_t::GetBitWidth(_,local_18ec), uVar4 != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)local_1ac8,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar10 = DiagnosticStream::operator<<
                          ((DiagnosticStream *)local_1ac8,
                           (char (*) [56])"Ray Direction must be a 32-bit float 3-component vector")
      ;
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_1ac8);
      return sVar5;
    }
    local_1acc = ValidationState_t::GetOperandTypeId(_,inst,5);
    bVar1 = ValidationState_t::IsFloatScalarType(_,local_1acc);
    if ((!bVar1) || (uVar4 = ValidationState_t::GetBitWidth(_,local_1acc), uVar4 != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)&error_11,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar10 = DiagnosticStream::operator<<
                          ((DiagnosticStream *)&error_11,
                           (char (*) [39])"Ray TMax must be a 32-bit float scalar");
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&error_11);
      return sVar5;
    }
    break;
  case OpHitObjectExecuteShaderNV:
    RayReorderNVPass::anon_class_1_0_00000001::operator()(&local_29,_,inst);
    variable_1._4_4_ = ValidateHitObjectPointer(_,inst,0);
    if (variable_1._4_4_ != SPV_SUCCESS) {
      return variable_1._4_4_;
    }
    variable_1._0_4_ = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIStack_1160 = ValidationState_t::FindDef(_,(uint)variable_1);
    local_1164 = Instruction::opcode(pIStack_1160);
    if (((pIStack_1160 == (Instruction *)0x0) || (local_1164 != OpVariable)) ||
       (SVar2 = Instruction::GetOperandAs<spv::StorageClass>(pIStack_1160,2), SVar2 != RayPayloadKHR
       )) {
      ValidationState_t::diag((DiagnosticStream *)&error_9,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar10 = DiagnosticStream::operator<<
                          ((DiagnosticStream *)&error_9,
                           (char (*) [77])
                           "Hit Object Attributes id must be a OpVariable of storage class RayPayloadKHR"
                          );
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&error_9);
      return sVar5;
    }
    break;
  case OpHitObjectGetCurrentTimeNV:
  case OpHitObjectGetRayTMaxNV:
  case OpHitObjectGetRayTMinNV:
    RayReorderNVPass::anon_class_1_0_00000001::operator()(&local_29,_,inst);
    local_5dc = ValidateHitObjectPointer(_,inst,2);
    if (local_5dc != SPV_SUCCESS) {
      return local_5dc;
    }
    bVar1 = ValidationState_t::IsFloatScalarType(_,local_28);
    if ((!bVar1) || (uVar4 = ValidationState_t::GetBitWidth(_,local_28), uVar4 != 0x20)) {
      ValidationState_t::diag(&local_7b8,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar10 = DiagnosticStream::operator<<
                          (&local_7b8,
                           (char (*) [60])
                           "Expected 32-bit floating-point type scalar as Result Type: ");
      _num_rows = spvOpcodeString(OStack_24);
      pDVar10 = DiagnosticStream::operator<<(pDVar10,(char **)&num_rows);
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      DiagnosticStream::~DiagnosticStream(&local_7b8);
      return sVar5;
    }
    break;
  case OpHitObjectGetAttributesNV:
    RayReorderNVPass::anon_class_1_0_00000001::operator()(&local_29,_,inst);
    variable._4_4_ = ValidateHitObjectPointer(_,inst,0);
    if (variable._4_4_ != SPV_SUCCESS) {
      return variable._4_4_;
    }
    variable._0_4_ = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIStack_f70 = ValidationState_t::FindDef(_,(uint)variable);
    local_f74 = Instruction::opcode(pIStack_f70);
    if (((pIStack_f70 == (Instruction *)0x0) || (local_f74 != OpVariable)) ||
       (SVar2 = Instruction::GetOperandAs<spv::StorageClass>(pIStack_f70,2),
       SVar2 != HitObjectAttributeNV)) {
      ValidationState_t::diag
                ((DiagnosticStream *)&hit_object_attr_id_1,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar10 = DiagnosticStream::operator<<
                          ((DiagnosticStream *)&hit_object_attr_id_1,
                           (char (*) [84])
                           "Hit Object Attributes id must be a OpVariable of storage class HitObjectAttributeNV"
                          );
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&hit_object_attr_id_1);
      return sVar5;
    }
    break;
  case OpHitObjectIsEmptyNV:
  case OpHitObjectIsHitNV:
  case OpHitObjectIsMissNV:
    RayReorderNVPass::anon_class_1_0_00000001::operator()(&local_29,_,inst);
    bVar1 = ValidationState_t::IsBoolScalarType(_,local_28);
    if (!bVar1) {
      ValidationState_t::diag((DiagnosticStream *)&error_1,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar10 = DiagnosticStream::operator<<((DiagnosticStream *)&error_1,(char (*) [44])0xf2b2a9);
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&error_1);
      return sVar5;
    }
    sVar5 = ValidateHitObjectPointer(_,inst,2);
joined_r0x00b6b4a6:
    if (sVar5 != SPV_SUCCESS) {
      return sVar5;
    }
    break;
  case OpReorderThreadWithHitObjectNV:
    OVar3 = Instruction::opcode(inst);
    pcVar8 = spvOpcodeString(OVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1ec8,pcVar8,&local_1ec9);
    std::allocator<char>::~allocator(&local_1ec9);
    pFVar9 = Instruction::function(inst);
    uVar4 = Function::id(pFVar9);
    pFVar9 = ValidationState_t::function(_,uVar4);
    std::__cxx11::string::string((string *)local_1f10,local_1ec8);
    std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
    function<spvtools::val::RayReorderNVPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__1,void>
              ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&local_1ef0,
               (anon_class_32_1_3dac1b3c *)local_1f10);
    Function::RegisterExecutionModelLimitation(pFVar9,&local_1ef0);
    std::
    function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
    ::~function(&local_1ef0);
    RayReorderNVPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::$_1::~__1
              ((__1 *)local_1f10);
    local_1f14 = ValidateHitObjectPointer(_,inst,0);
    if (local_1f14 == SPV_SUCCESS) {
      pvVar6 = Instruction::operands(inst);
      sVar7 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(pvVar6)
      ;
      if (sVar7 < 2) {
LAB_00b6c6bc:
        local_1f18 = 2;
      }
      else {
        pvVar6 = Instruction::operands(inst);
        sVar7 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size
                          (pvVar6);
        if (sVar7 == 3) {
          local_20f4 = ValidationState_t::GetOperandTypeId(_,inst,1);
          bVar1 = ValidationState_t::IsIntScalarType(_,local_20f4);
          if ((bVar1) && (uVar4 = ValidationState_t::GetBitWidth(_,local_20f4), uVar4 == 0x20)) {
            uVar4 = ValidationState_t::GetOperandTypeId(_,inst,2);
            bVar1 = ValidationState_t::IsIntScalarType(_,uVar4);
            if ((bVar1) && (uVar4 = ValidationState_t::GetBitWidth(_,uVar4), uVar4 == 0x20))
            goto LAB_00b6c6bc;
            ValidationState_t::diag
                      ((DiagnosticStream *)((long)&opcode_name_1.field_2 + 8),_,
                       SPV_ERROR_INVALID_DATA,inst);
            pDVar10 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)((long)&opcode_name_1.field_2 + 8),
                                 (char (*) [33])"bits must be a 32-bit int scalar");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream
                      ((DiagnosticStream *)((long)&opcode_name_1.field_2 + 8));
            local_1f18 = 1;
          }
          else {
            ValidationState_t::diag((DiagnosticStream *)local_22d0,_,SPV_ERROR_INVALID_DATA,inst);
            pDVar10 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)local_22d0,
                                 (char (*) [33])"Hint must be a 32-bit int scalar");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_22d0);
            local_1f18 = 1;
          }
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_20f0,_,SPV_ERROR_INVALID_DATA,inst);
          pDVar10 = DiagnosticStream::operator<<
                              ((DiagnosticStream *)local_20f0,
                               (char (*) [41])"Hint and Bits are optional together i.e ");
          pDVar10 = DiagnosticStream::operator<<
                              (pDVar10,(char (*) [58])
                                       " Either both Hint and Bits should be provided or neither.");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_20f0);
          local_1f18 = 1;
        }
      }
    }
    else {
      local_1f18 = 1;
      __local._4_4_ = local_1f14;
    }
    std::__cxx11::string::~string(local_1ec8);
    goto joined_r0x00b6c8f4;
  case OpReorderThreadWithHintNV:
    OVar3 = Instruction::opcode(inst);
    pcVar8 = spvOpcodeString(OVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_24d0,pcVar8,&local_24d1);
    std::allocator<char>::~allocator(&local_24d1);
    pFVar9 = Instruction::function(inst);
    uVar4 = Function::id(pFVar9);
    pFVar9 = ValidationState_t::function(_,uVar4);
    std::__cxx11::string::string((string *)local_2518,local_24d0);
    std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
    function<spvtools::val::RayReorderNVPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__2,void>
              ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&local_24f8,
               (anon_class_32_1_3dac1b3c *)local_2518);
    Function::RegisterExecutionModelLimitation(pFVar9,&local_24f8);
    std::
    function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
    ::~function(&local_24f8);
    RayReorderNVPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::$_2::~__2
              ((__2 *)local_2518);
    local_251c = ValidationState_t::GetOperandTypeId(_,inst,0);
    bVar1 = ValidationState_t::IsIntScalarType(_,local_251c);
    if ((bVar1) && (uVar4 = ValidationState_t::GetBitWidth(_,local_251c), uVar4 == 0x20)) {
      local_26fc = ValidationState_t::GetOperandTypeId(_,inst,1);
      bVar1 = ValidationState_t::IsIntScalarType(_,local_26fc);
      if ((bVar1) && (uVar4 = ValidationState_t::GetBitWidth(_,local_26fc), uVar4 == 0x20)) {
        local_1f18 = 2;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_28d8,_,SPV_ERROR_INVALID_DATA,inst);
        pDVar10 = DiagnosticStream::operator<<
                            ((DiagnosticStream *)local_28d8,
                             (char (*) [33])"bits must be a 32-bit int scalar");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_28d8);
        local_1f18 = 1;
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_26f8,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar10 = DiagnosticStream::operator<<
                          ((DiagnosticStream *)local_26f8,
                           (char (*) [33])"Hint must be a 32-bit int scalar");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_26f8);
      local_1f18 = 1;
    }
    std::__cxx11::string::~string(local_24d0);
joined_r0x00b6c8f4:
    if (local_1f18 == 1) {
      return __local._4_4_;
    }
    break;
  default:
    break;
  case OpHitObjectGetClusterIdNV:
    RayReorderNVPass::anon_class_1_0_00000001::operator()(&local_29,_,inst);
    local_28dc = ValidateHitObjectPointer(_,inst,2);
    if (local_28dc != SPV_SUCCESS) {
      return local_28dc;
    }
    bVar1 = ValidationState_t::IsIntScalarType(_,local_28);
    if ((!bVar1) || (uVar4 = ValidationState_t::GetBitWidth(_,local_28), uVar4 != 0x20)) {
      ValidationState_t::diag(&local_2ab8,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar10 = DiagnosticStream::operator<<
                          (&local_2ab8,
                           (char (*) [53])"Expected 32-bit integer type scalar as Result Type: ");
      pcStack_2ac0 = spvOpcodeString(OStack_24);
      pDVar10 = DiagnosticStream::operator<<(pDVar10,&stack0xffffffffffffd540);
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      DiagnosticStream::~DiagnosticStream(&local_2ab8);
      return sVar5;
    }
    break;
  case OpHitObjectGetSpherePositionNV:
    RayReorderNVPass::anon_class_1_0_00000001::operator()(&local_29,_,inst);
    local_2ac4 = ValidateHitObjectPointer(_,inst,2);
    if (local_2ac4 != SPV_SUCCESS) {
      return local_2ac4;
    }
    bVar1 = ValidationState_t::IsFloatVectorType(_,local_28);
    if (((!bVar1) || (uVar4 = ValidationState_t::GetDimension(_,local_28), uVar4 != 3)) ||
       (uVar4 = ValidationState_t::GetBitWidth(_,local_28), uVar4 != 0x20)) {
      ValidationState_t::diag(&local_2ca0,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar10 = DiagnosticStream::operator<<
                          (&local_2ca0,
                           (char (*) [72])
                           "Expected 32-bit floating point 2 component vector type as Result Type: "
                          );
      pcStack_2ca8 = spvOpcodeString(OStack_24);
      pDVar10 = DiagnosticStream::operator<<(pDVar10,&stack0xffffffffffffd358);
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      DiagnosticStream::~DiagnosticStream(&local_2ca0);
      return sVar5;
    }
    break;
  case OpHitObjectGetSphereRadiusNV:
    RayReorderNVPass::anon_class_1_0_00000001::operator()(&local_29,_,inst);
    local_2cac = ValidateHitObjectPointer(_,inst,2);
    if (local_2cac != SPV_SUCCESS) {
      return local_2cac;
    }
    bVar1 = ValidationState_t::IsFloatScalarType(_,local_28);
    if ((!bVar1) || (uVar4 = ValidationState_t::GetBitWidth(_,local_28), uVar4 != 0x20)) {
      ValidationState_t::diag(&local_2e88,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar10 = DiagnosticStream::operator<<
                          (&local_2e88,
                           (char (*) [55])"Expected 32-bit floating point scalar as Result Type: ");
      pcStack_2e90 = spvOpcodeString(OStack_24);
      pDVar10 = DiagnosticStream::operator<<(pDVar10,&stack0xffffffffffffd170);
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      DiagnosticStream::~DiagnosticStream(&local_2e88);
      return sVar5;
    }
    break;
  case OpHitObjectGetLSSPositionsNV:
    RayReorderNVPass::anon_class_1_0_00000001::operator()(&local_29,_,inst);
    result_id._4_4_ = ValidateHitObjectPointer(_,inst,2);
    if (result_id._4_4_ != SPV_SUCCESS) {
      return result_id._4_4_;
    }
    local_2ea0 = ValidationState_t::FindDef(_,local_28);
    OVar3 = Instruction::opcode(local_2ea0);
    if ((OVar3 == OpTypeArray) && (uVar4 = GetArrayLength(_,local_2ea0), uVar4 == 2)) {
      uVar4 = ValidationState_t::GetComponentType(_,local_28);
      bVar1 = ValidationState_t::IsFloatVectorType(_,uVar4);
      if (bVar1) {
        uVar4 = ValidationState_t::GetComponentType(_,local_28);
        uVar4 = ValidationState_t::GetDimension(_,uVar4);
        if (uVar4 == 3) {
          return SPV_SUCCESS;
        }
      }
    }
    ValidationState_t::diag(&local_3078,_,SPV_ERROR_INVALID_DATA,inst);
    pDVar10 = DiagnosticStream::operator<<
                        (&local_3078,
                         (char (*) [83])
                         "Expected 2 element array of 32-bit 3 component float point vector as Result Type: "
                        );
    pcStack_3080 = spvOpcodeString(OStack_24);
    pDVar10 = DiagnosticStream::operator<<(pDVar10,&stack0xffffffffffffcf80);
    sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
    DiagnosticStream::~DiagnosticStream(&local_3078);
    return sVar5;
  case OpHitObjectGetLSSRadiiNV:
    RayReorderNVPass::anon_class_1_0_00000001::operator()(&local_29,_,inst);
    local_3084 = ValidateHitObjectPointer(_,inst,2);
    if (local_3084 != SPV_SUCCESS) {
      return local_3084;
    }
    bVar1 = ValidationState_t::IsFloatArrayType(_,local_28);
    if (bVar1) {
      array_type = ValidationState_t::FindDef(_,local_28);
      uVar4 = GetArrayLength(_,array_type);
      if (uVar4 == 2) {
        uVar4 = ValidationState_t::GetComponentType(_,local_28);
        bVar1 = ValidationState_t::IsFloatScalarType(_,uVar4);
        if (bVar1) {
          return SPV_SUCCESS;
        }
      }
    }
    ValidationState_t::diag(&local_3260,_,SPV_ERROR_INVALID_DATA,inst);
    pDVar10 = DiagnosticStream::operator<<
                        (&local_3260,
                         (char (*) [74])
                         "Expected 2 element array of 32-bit floating point scalar as Result Type: "
                        );
    pcStack_3268 = spvOpcodeString(OStack_24);
    pDVar10 = DiagnosticStream::operator<<(pDVar10,&stack0xffffffffffffcd98);
    sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
    DiagnosticStream::~DiagnosticStream(&local_3260);
    return sVar5;
  case OpHitObjectIsSphereHitNV:
    RayReorderNVPass::anon_class_1_0_00000001::operator()(&local_29,_,inst);
    local_326c = ValidateHitObjectPointer(_,inst,2);
    if (local_326c != SPV_SUCCESS) {
      return local_326c;
    }
    bVar1 = ValidationState_t::IsBoolScalarType(_,local_28);
    if (!bVar1) {
      ValidationState_t::diag(&local_3448,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar10 = DiagnosticStream::operator<<
                          (&local_3448,(char (*) [41])"Expected Boolean scalar as Result Type: ");
      pcStack_3450 = spvOpcodeString(OStack_24);
      pDVar10 = DiagnosticStream::operator<<(pDVar10,&stack0xffffffffffffcbb0);
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      DiagnosticStream::~DiagnosticStream(&local_3448);
      return sVar5;
    }
    break;
  case OpHitObjectIsLSSHitNV:
    RayReorderNVPass::anon_class_1_0_00000001::operator()(&local_29,_,inst);
    local_3454 = ValidateHitObjectPointer(_,inst,2);
    if (local_3454 != SPV_SUCCESS) {
      return local_3454;
    }
    bVar1 = ValidationState_t::IsBoolScalarType(_,local_28);
    if (!bVar1) {
      ValidationState_t::diag(&local_3630,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar10 = DiagnosticStream::operator<<
                          (&local_3630,(char (*) [41])"Expected Boolean scalar as Result Type: ");
      local_3638 = spvOpcodeString(OStack_24);
      pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_3638);
      sVar5 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      DiagnosticStream::~DiagnosticStream(&local_3630);
      return sVar5;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t RayReorderNVPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  const uint32_t result_type = inst->type_id();

  auto RegisterOpcodeForValidModel = [](ValidationState_t& vs,
                                        const Instruction* rtinst) {
    std::string opcode_name = spvOpcodeString(rtinst->opcode());
    vs.function(rtinst->function()->id())
        ->RegisterExecutionModelLimitation(
            [opcode_name](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::RayGenerationKHR &&
                  model != spv::ExecutionModel::ClosestHitKHR &&
                  model != spv::ExecutionModel::MissKHR) {
                if (message) {
                  *message = opcode_name +
                             " requires RayGenerationKHR, ClosestHitKHR and "
                             "MissKHR execution models";
                }
                return false;
              }
              return true;
            });
    return;
  };

  switch (opcode) {
    case spv::Op::OpHitObjectIsMissNV:
    case spv::Op::OpHitObjectIsHitNV:
    case spv::Op::OpHitObjectIsEmptyNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (!_.IsBoolScalarType(result_type)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type to be bool scalar type";
      }

      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;
      break;
    }

    case spv::Op::OpHitObjectGetShaderRecordBufferHandleNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;

      if (!_.IsIntVectorType(result_type) ||
          (_.GetDimension(result_type) != 2) ||
          (_.GetBitWidth(result_type) != 32))
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected 32-bit integer type 2-component vector as Result "
                  "Type: "
               << spvOpcodeString(opcode);
      break;
    }

    case spv::Op::OpHitObjectGetHitKindNV:
    case spv::Op::OpHitObjectGetPrimitiveIndexNV:
    case spv::Op::OpHitObjectGetGeometryIndexNV:
    case spv::Op::OpHitObjectGetInstanceIdNV:
    case spv::Op::OpHitObjectGetInstanceCustomIndexNV:
    case spv::Op::OpHitObjectGetShaderBindingTableRecordIndexNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;

      if (!_.IsIntScalarType(result_type) || !_.GetBitWidth(result_type))
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected 32-bit integer type scalar as Result Type: "
               << spvOpcodeString(opcode);
      break;
    }

    case spv::Op::OpHitObjectGetCurrentTimeNV:
    case spv::Op::OpHitObjectGetRayTMaxNV:
    case spv::Op::OpHitObjectGetRayTMinNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;

      if (!_.IsFloatScalarType(result_type) || _.GetBitWidth(result_type) != 32)
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected 32-bit floating-point type scalar as Result Type: "
               << spvOpcodeString(opcode);
      break;
    }

    case spv::Op::OpHitObjectGetObjectToWorldNV:
    case spv::Op::OpHitObjectGetWorldToObjectNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;

      uint32_t num_rows = 0;
      uint32_t num_cols = 0;
      uint32_t col_type = 0;
      uint32_t component_type = 0;

      if (!_.GetMatrixTypeInfo(result_type, &num_rows, &num_cols, &col_type,
                               &component_type)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected matrix type as Result Type: "
               << spvOpcodeString(opcode);
      }

      if (num_cols != 4) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type matrix to have a Column Count of 4"
               << spvOpcodeString(opcode);
      }

      if (!_.IsFloatScalarType(component_type) ||
          _.GetBitWidth(result_type) != 32 || num_rows != 3) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type matrix to have a Column Type of "
                  "3-component 32-bit float vectors: "
               << spvOpcodeString(opcode);
      }
      break;
    }

    case spv::Op::OpHitObjectGetObjectRayOriginNV:
    case spv::Op::OpHitObjectGetObjectRayDirectionNV:
    case spv::Op::OpHitObjectGetWorldRayDirectionNV:
    case spv::Op::OpHitObjectGetWorldRayOriginNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;

      if (!_.IsFloatVectorType(result_type) ||
          (_.GetDimension(result_type) != 3) ||
          (_.GetBitWidth(result_type) != 32))
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected 32-bit floating-point type 3-component vector as "
                  "Result Type: "
               << spvOpcodeString(opcode);
      break;
    }

    case spv::Op::OpHitObjectGetAttributesNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 0)) return error;

      const uint32_t hit_object_attr_id = inst->GetOperandAs<uint32_t>(1);
      auto variable = _.FindDef(hit_object_attr_id);
      const auto var_opcode = variable->opcode();
      if (!variable || var_opcode != spv::Op::OpVariable ||
          variable->GetOperandAs<spv::StorageClass>(2) !=
              spv::StorageClass::HitObjectAttributeNV) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Hit Object Attributes id must be a OpVariable of storage "
                  "class HitObjectAttributeNV";
      }
      break;
    }

    case spv::Op::OpHitObjectExecuteShaderNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 0)) return error;

      const uint32_t hit_object_attr_id = inst->GetOperandAs<uint32_t>(1);
      auto variable = _.FindDef(hit_object_attr_id);
      const auto var_opcode = variable->opcode();
      if (!variable || var_opcode != spv::Op::OpVariable ||
          (variable->GetOperandAs<spv::StorageClass>(2)) !=
              spv::StorageClass::RayPayloadKHR) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Hit Object Attributes id must be a OpVariable of storage "
                  "class RayPayloadKHR";
      }
      break;
    }

    case spv::Op::OpHitObjectRecordEmptyNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 0)) return error;
      break;
    }

    case spv::Op::OpHitObjectRecordMissNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 0)) return error;

      const uint32_t miss_index = _.GetOperandTypeId(inst, 1);
      if (!_.IsUnsignedIntScalarType(miss_index) ||
          _.GetBitWidth(miss_index) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Miss Index must be a 32-bit int scalar";
      }

      const uint32_t ray_origin = _.GetOperandTypeId(inst, 2);
      if (!_.IsFloatVectorType(ray_origin) || _.GetDimension(ray_origin) != 3 ||
          _.GetBitWidth(ray_origin) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray Origin must be a 32-bit float 3-component vector";
      }

      const uint32_t ray_tmin = _.GetOperandTypeId(inst, 3);
      if (!_.IsFloatScalarType(ray_tmin) || _.GetBitWidth(ray_tmin) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray TMin must be a 32-bit float scalar";
      }

      const uint32_t ray_direction = _.GetOperandTypeId(inst, 4);
      if (!_.IsFloatVectorType(ray_direction) ||
          _.GetDimension(ray_direction) != 3 ||
          _.GetBitWidth(ray_direction) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray Direction must be a 32-bit float 3-component vector";
      }

      const uint32_t ray_tmax = _.GetOperandTypeId(inst, 5);
      if (!_.IsFloatScalarType(ray_tmax) || _.GetBitWidth(ray_tmax) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray TMax must be a 32-bit float scalar";
      }
      break;
    }

    case spv::Op::OpHitObjectRecordHitWithIndexNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 0)) return error;

      if (auto error = ValidateHitObjectInstructionCommonParameters(
              _, inst, 1 /* Acceleration Struct */, 2 /* Instance Id */,
              3 /* Primtive Id */, 4 /* Geometry Index */,
              KRayParamInvalidId /* Ray Flags */,
              KRayParamInvalidId /* Cull Mask */, 5 /* Hit Kind*/,
              6 /* SBT index */, KRayParamInvalidId /* SBT Offset */,
              KRayParamInvalidId /* SBT Stride */,
              KRayParamInvalidId /* SBT Record Offset */,
              KRayParamInvalidId /* SBT Record Stride */,
              KRayParamInvalidId /* Miss Index */, 7 /* Ray Origin */,
              8 /* Ray TMin */, 9 /* Ray Direction */, 10 /* Ray TMax */,
              KRayParamInvalidId /* Payload */, 11 /* Hit Object Attribute */))
        return error;

      break;
    }

    case spv::Op::OpHitObjectRecordHitNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 0)) return error;

      if (auto error = ValidateHitObjectInstructionCommonParameters(
              _, inst, 1 /* Acceleration Struct */, 2 /* Instance Id */,
              3 /* Primtive Id */, 4 /* Geometry Index */,
              KRayParamInvalidId /* Ray Flags */,
              KRayParamInvalidId /* Cull Mask */, 5 /* Hit Kind*/,
              KRayParamInvalidId /* SBT index */,
              KRayParamInvalidId /* SBT Offset */,
              KRayParamInvalidId /* SBT Stride */, 6 /* SBT Record Offset */,
              7 /* SBT Record Stride */, KRayParamInvalidId /* Miss Index */,
              8 /* Ray Origin */, 9 /* Ray TMin */, 10 /* Ray Direction */,
              11 /* Ray TMax */, KRayParamInvalidId /* Payload */,
              12 /* Hit Object Attribute */))
        return error;

      break;
    }

    case spv::Op::OpHitObjectTraceRayMotionNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 0)) return error;

      if (auto error = ValidateHitObjectInstructionCommonParameters(
              _, inst, 1 /* Acceleration Struct */,
              KRayParamInvalidId /* Instance Id */,
              KRayParamInvalidId /* Primtive Id */,
              KRayParamInvalidId /* Geometry Index */, 2 /* Ray Flags */,
              3 /* Cull Mask */, KRayParamInvalidId /* Hit Kind*/,
              KRayParamInvalidId /* SBT index */, 4 /* SBT Offset */,
              5 /* SBT Stride */, KRayParamInvalidId /* SBT Record Offset */,
              KRayParamInvalidId /* SBT Record Stride */, 6 /* Miss Index */,
              7 /* Ray Origin */, 8 /* Ray TMin */, 9 /* Ray Direction */,
              10 /* Ray TMax */, 12 /* Payload */,
              KRayParamInvalidId /* Hit Object Attribute */))
        return error;
      // Current Time
      const uint32_t current_time_id = _.GetOperandTypeId(inst, 11);
      if (!_.IsFloatScalarType(current_time_id) ||
          _.GetBitWidth(current_time_id) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Current Times must be a 32-bit float scalar type";
      }

      break;
    }

    case spv::Op::OpHitObjectTraceRayNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 0)) return error;

      if (auto error = ValidateHitObjectInstructionCommonParameters(
              _, inst, 1 /* Acceleration Struct */,
              KRayParamInvalidId /* Instance Id */,
              KRayParamInvalidId /* Primtive Id */,
              KRayParamInvalidId /* Geometry Index */, 2 /* Ray Flags */,
              3 /* Cull Mask */, KRayParamInvalidId /* Hit Kind*/,
              KRayParamInvalidId /* SBT index */, 4 /* SBT Offset */,
              5 /* SBT Stride */, KRayParamInvalidId /* SBT Record Offset */,
              KRayParamInvalidId /* SBT Record Stride */, 6 /* Miss Index */,
              7 /* Ray Origin */, 8 /* Ray TMin */, 9 /* Ray Direction */,
              10 /* Ray TMax */, 11 /* Payload */,
              KRayParamInvalidId /* Hit Object Attribute */))
        return error;
      break;
    }

    case spv::Op::OpReorderThreadWithHitObjectNV: {
      std::string opcode_name = spvOpcodeString(inst->opcode());
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [opcode_name](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::RayGenerationKHR) {
                  if (message) {
                    *message = opcode_name +
                               " requires RayGenerationKHR execution model";
                  }
                  return false;
                }
                return true;
              });

      if (auto error = ValidateHitObjectPointer(_, inst, 0)) return error;

      if (inst->operands().size() > 1) {
        if (inst->operands().size() != 3) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Hint and Bits are optional together i.e "
                 << " Either both Hint and Bits should be provided or neither.";
        }

        // Validate the optional opreands Hint and Bits
        const uint32_t hint_id = _.GetOperandTypeId(inst, 1);
        if (!_.IsIntScalarType(hint_id) || _.GetBitWidth(hint_id) != 32) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Hint must be a 32-bit int scalar";
        }
        const uint32_t bits_id = _.GetOperandTypeId(inst, 2);
        if (!_.IsIntScalarType(bits_id) || _.GetBitWidth(bits_id) != 32) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "bits must be a 32-bit int scalar";
        }
      }
      break;
    }

    case spv::Op::OpReorderThreadWithHintNV: {
      std::string opcode_name = spvOpcodeString(inst->opcode());
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [opcode_name](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::RayGenerationKHR) {
                  if (message) {
                    *message = opcode_name +
                               " requires RayGenerationKHR execution model";
                  }
                  return false;
                }
                return true;
              });

      const uint32_t hint_id = _.GetOperandTypeId(inst, 0);
      if (!_.IsIntScalarType(hint_id) || _.GetBitWidth(hint_id) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Hint must be a 32-bit int scalar";
      }

      const uint32_t bits_id = _.GetOperandTypeId(inst, 1);
      if (!_.IsIntScalarType(bits_id) || _.GetBitWidth(bits_id) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "bits must be a 32-bit int scalar";
      }
      break;
    }

    case spv::Op::OpHitObjectGetClusterIdNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;

      if (!_.IsIntScalarType(result_type) || _.GetBitWidth(result_type) != 32)
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected 32-bit integer type scalar as Result Type: "
               << spvOpcodeString(opcode);
      break;
    }

    case spv::Op::OpHitObjectGetSpherePositionNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;

      if (!_.IsFloatVectorType(result_type) ||
          _.GetDimension(result_type) != 3 ||
          _.GetBitWidth(result_type) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected 32-bit floating point 2 component vector type as "
                  "Result Type: "
               << spvOpcodeString(opcode);
      }
      break;
    }

    case spv::Op::OpHitObjectGetSphereRadiusNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;

      if (!_.IsFloatScalarType(result_type) ||
          _.GetBitWidth(result_type) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected 32-bit floating point scalar as Result Type: "
               << spvOpcodeString(opcode);
      }
      break;
    }

    case spv::Op::OpHitObjectGetLSSPositionsNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;

      auto result_id = _.FindDef(result_type);
      if ((result_id->opcode() != spv::Op::OpTypeArray) ||
          (GetArrayLength(_, result_id) != 2) ||
          !_.IsFloatVectorType(_.GetComponentType(result_type)) ||
          _.GetDimension(_.GetComponentType(result_type)) != 3) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected 2 element array of 32-bit 3 component float point "
                  "vector as Result Type: "
               << spvOpcodeString(opcode);
      }
      break;
    }

    case spv::Op::OpHitObjectGetLSSRadiiNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;

      if (!_.IsFloatArrayType(result_type) ||
          (GetArrayLength(_, _.FindDef(result_type)) != 2) ||
          !_.IsFloatScalarType(_.GetComponentType(result_type))) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected 2 element array of 32-bit floating point scalar as "
                  "Result Type: "
               << spvOpcodeString(opcode);
      }
      break;
    }

    case spv::Op::OpHitObjectIsSphereHitNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;

      if (!_.IsBoolScalarType(result_type)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected Boolean scalar as Result Type: "
               << spvOpcodeString(opcode);
      }
      break;
    }

    case spv::Op::OpHitObjectIsLSSHitNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;

      if (!_.IsBoolScalarType(result_type)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected Boolean scalar as Result Type: "
               << spvOpcodeString(opcode);
      }
      break;
    }

    default:
      break;
  }
  return SPV_SUCCESS;
}